

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O0

char * __thiscall cppcms::impl::string_pool::add(string_pool *this,char *s,size_t len)

{
  char *in_RDX;
  string_pool *in_RSI;
  size_t in_RDI;
  bool bVar1;
  size_t real_len;
  char *tmp;
  char *pcVar2;
  
  pcVar2 = (char *)0x0;
  while( true ) {
    bVar1 = false;
    if (pcVar2 < in_RDX) {
      bVar1 = (char)in_RSI->page_size_ != '\0';
    }
    if (!bVar1) break;
    pcVar2 = pcVar2 + 1;
    in_RSI = (string_pool *)((long)&in_RSI->page_size_ + 1);
  }
  pcVar2 = add_bounded_string(in_RSI,pcVar2,in_RDI);
  return pcVar2;
}

Assistant:

char *add(char const *s,size_t len)
			{
				char const *tmp = s;
				size_t real_len = 0;
				while(real_len < len && *tmp!=0) {
					real_len ++;
					tmp++;
				}
				return add_bounded_string(s,real_len);
			}